

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintComment(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  
  pprint = &doc->pprint;
  SetWrap(doc,indent);
  AddString(pprint,"<!--");
  PPrintText(doc,2,0,node);
  AddString(pprint,"--");
  AddChar(pprint,0x3e);
  if ((node->linebreak != no) && (node->next != (Node *)0x0)) {
    prvTidyPFlushLineSmart(doc,indent);
    return;
  }
  return;
}

Assistant:

static void PPrintComment( TidyDocImpl* doc, uint indent, Node* node )
{
    TidyPrintImpl* pprint = &doc->pprint;

    SetWrap( doc, indent );
    AddString( pprint, "<!--" );

    PPrintText(doc, COMMENT, 0, node);

    AddString(pprint, "--");
    AddChar( pprint, '>' );
    if ( node->linebreak && node->next )
        TY_(PFlushLineSmart)( doc, indent );
}